

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_modules(options_i *options,vw *all)

{
  typed_option<unsigned_long> *this;
  ostream *poVar1;
  void *pvVar2;
  long *in_RSI;
  undefined8 *in_RDI;
  option_group_definition rand_options;
  vw *in_stack_00000278;
  options_i *in_stack_00000280;
  vw *in_stack_00000898;
  options_i *in_stack_000008a0;
  vw *in_stack_00001358;
  options_i *in_stack_00001360;
  vw *in_stack_00002ca8;
  options_i *in_stack_00002cb0;
  string *in_stack_fffffffffffffe18;
  typed_option<unsigned_long> *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  typed_option<unsigned_long> *in_stack_fffffffffffffe68;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [215];
  allocator local_69;
  string local_68 [32];
  vw *in_stack_ffffffffffffffb8;
  options_i *in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Randomization options",&local_69);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"random_seed",&local_141);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"seed random number generator",&local_169);
  this = VW::config::typed_option<unsigned_long>::help
                   (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)this,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  VW::config::typed_option<unsigned_long>::~typed_option(in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  (**(code **)*in_RDI)(in_RDI,&stack0xffffffffffffffb8);
  in_RSI[0x689] = in_RSI[0x688];
  parse_feature_tweaks(in_stack_00002cb0,in_stack_00002ca8);
  parse_example_tweaks(in_stack_00001360,in_stack_00001358);
  parse_output_model(in_stack_000008a0,in_stack_00000898);
  parse_output_preds(in_stack_00000280,in_stack_00000278);
  parse_reductions(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if ((*(byte *)((long)in_RSI + 0x3439) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x1c),"Num weight bits = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 10));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x1c),"learning rate = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0x6ac));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x1c),"initial_t = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(*in_RSI + 0x18));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x1c),"power_t = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(float *)((long)in_RSI + 0x334));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    if (1 < (ulong)in_RSI[0x69]) {
      poVar1 = std::operator<<((ostream *)(in_RSI + 0x1c),"decay_learning_rate = ");
      in_stack_fffffffffffffe20 =
           (typed_option<unsigned_long> *)
           std::ostream::operator<<(poVar1,*(float *)((long)in_RSI + 0x3564));
      std::ostream::operator<<(in_stack_fffffffffffffe20,std::endl<char,std::char_traits<char>>);
    }
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe20);
  return;
}

Assistant:

void parse_modules(options_i& options, vw& all)
{
  option_group_definition rand_options("Randomization options");
  rand_options.add(make_option("random_seed", all.random_seed).help("seed random number generator"));
  options.add_and_parse(rand_options);
  all.random_state = all.random_seed;

  parse_feature_tweaks(options, all);  // feature tweaks

  parse_example_tweaks(options, all);  // example manipulation

  parse_output_model(options, all);

  parse_output_preds(options, all);

  parse_reductions(options, all);

  if (!all.quiet)
  {
    all.trace_message << "Num weight bits = " << all.num_bits << endl;
    all.trace_message << "learning rate = " << all.eta << endl;
    all.trace_message << "initial_t = " << all.sd->t << endl;
    all.trace_message << "power_t = " << all.power_t << endl;
    if (all.numpasses > 1)
      all.trace_message << "decay_learning_rate = " << all.eta_decay_rate << endl;
  }
}